

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void copyNodeContent(MemPage *pFrom,MemPage *pTo,int *pRC)

{
  byte bVar1;
  Pgno PVar2;
  BtShared *pBVar3;
  u8 *puVar4;
  u8 *puVar5;
  ushort uVar6;
  int iVar7;
  u8 *__dest;
  
  if (*pRC != 0) {
    return;
  }
  pBVar3 = pFrom->pBt;
  puVar4 = pFrom->aData;
  puVar5 = pTo->aData;
  bVar1 = pFrom->hdrOffset;
  PVar2 = pTo->pgno;
  uVar6 = *(ushort *)(puVar4 + (ulong)bVar1 + 5) << 8 | *(ushort *)(puVar4 + (ulong)bVar1 + 5) >> 8;
  memcpy(puVar5 + uVar6,puVar4 + uVar6,(ulong)(pBVar3->usableSize - (uint)uVar6));
  __dest = puVar5 + 100;
  if (PVar2 != 1) {
    __dest = puVar5;
  }
  memcpy(__dest,puVar4 + bVar1,(ulong)pFrom->cellOffset + (ulong)pFrom->nCell * 2);
  pTo->isInit = '\0';
  iVar7 = btreeInitPage(pTo);
  if (iVar7 == 0) {
    iVar7 = btreeComputeFreeSpace(pTo);
  }
  if (iVar7 == 0) {
    if (pBVar3->autoVacuum == '\0') {
      return;
    }
    iVar7 = setChildPtrmaps(pTo);
  }
  *pRC = iVar7;
  return;
}

Assistant:

static void copyNodeContent(MemPage *pFrom, MemPage *pTo, int *pRC){
  if( (*pRC)==SQLITE_OK ){
    BtShared * const pBt = pFrom->pBt;
    u8 * const aFrom = pFrom->aData;
    u8 * const aTo = pTo->aData;
    int const iFromHdr = pFrom->hdrOffset;
    int const iToHdr = ((pTo->pgno==1) ? 100 : 0);
    int rc;
    int iData;


    assert( pFrom->isInit );
    assert( pFrom->nFree>=iToHdr );
    assert( get2byte(&aFrom[iFromHdr+5]) <= (int)pBt->usableSize );

    /* Copy the b-tree node content from page pFrom to page pTo. */
    iData = get2byte(&aFrom[iFromHdr+5]);
    memcpy(&aTo[iData], &aFrom[iData], pBt->usableSize-iData);
    memcpy(&aTo[iToHdr], &aFrom[iFromHdr], pFrom->cellOffset + 2*pFrom->nCell);

    /* Reinitialize page pTo so that the contents of the MemPage structure
    ** match the new data. The initialization of pTo can actually fail under
    ** fairly obscure circumstances, even though it is a copy of initialized
    ** page pFrom.
    */
    pTo->isInit = 0;
    rc = btreeInitPage(pTo);
    if( rc==SQLITE_OK ) rc = btreeComputeFreeSpace(pTo);
    if( rc!=SQLITE_OK ){
      *pRC = rc;
      return;
    }

    /* If this is an auto-vacuum database, update the pointer-map entries
    ** for any b-tree or overflow pages that pTo now contains the pointers to.
    */
    if( ISAUTOVACUUM ){
      *pRC = setChildPtrmaps(pTo);
    }
  }
}